

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::DiffComplex<KTXanimData>::printText
          (DiffComplex<KTXanimData> *this,size_t index,PrintIndent *out,char *prefix)

{
  char *in_stack_00000040;
  PrintIndent *in_stack_00000048;
  KTXanimData *in_stack_00000050;
  
  std::optional<KTXanimData>::operator->((optional<KTXanimData> *)0x171122);
  CommandCompare::compareKVEntry(ktx::PrintDiff&,std::basic_string_view<char,std::
  char_traits<char>>const&,ktxKVListEntry*,ktxKVListEntry*)::KTXanimData::printText(ktx::
  PrintIndent__char_const___const(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }